

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

uint64_t load_helper(CPUArchState_conflict30 *env,target_ulong_conflict addr,TCGMemOpIdx oi,
                    uintptr_t retaddr,MemOp op,_Bool code_read,FullLoadHelper_conflict14 *full_load)

{
  int iVar1;
  uc_struct *puVar2;
  void *pvVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  _Bool _Var7;
  char cVar8;
  uint uVar9;
  MemoryRegion *pMVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  MemOp MVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint *puVar18;
  list_item *plVar19;
  uint uVar20;
  uint uVar21;
  CPUIOTLBEntry *iotlbentry;
  ulong addr_00;
  MMUAccessType access_type;
  undefined7 in_register_00000089;
  ulong uVar22;
  uint *puVar24;
  CPUArchState_conflict30 *elt_ofs;
  ulong uVar25;
  CPUArchState_conflict30 *pCVar26;
  MemOp op_00;
  uintptr_t in_stack_ffffffffffffff48;
  uint local_a4;
  ulong local_a0;
  ulong len;
  size_t index;
  uintptr_t uVar23;
  
  uVar15 = (ulong)(oi & 0xf);
  uVar25 = (ulong)((oi & 0xf) << 4);
  uVar9 = addr >> 0xe;
  uVar20 = *(uint *)((long)env->gpr_a + (uVar25 - 0x40)) >> 6 & uVar9;
  index = (size_t)uVar20;
  puVar24 = (uint *)((ulong)(uVar20 << 6) + *(long *)((long)env->gpr_a + (uVar25 - 0x38)));
  iVar1 = (int)CONCAT71(in_register_00000089,code_read);
  elt_ofs = (CPUArchState_conflict30 *)(ulong)(uint)(iVar1 * 8);
  uVar20 = oi >> 4 & 0x70;
  if (uVar20 != 0) {
    if (uVar20 == 0x70) {
      uVar20 = oi >> 4 & 3;
    }
    else {
      uVar20 = uVar20 >> 4;
    }
  }
  iVar1 = iVar1 * 2;
  local_a4 = *(uint *)((long)elt_ofs->gpr_a + (long)puVar24);
  MVar13 = op & MO_64;
  uVar14 = 1 << (sbyte)MVar13;
  len = (ulong)uVar14;
  puVar2 = (uc_struct *)env->uc;
  addr_00 = (ulong)addr;
  if ((~(-1 << ((byte)uVar20 & 0x1f)) & addr) != 0) {
    (**(code **)(*(long *)&env[-4].end_reset_fields + 0x18))
              (&env[-0x32].cpu_model,addr_00,iVar1,uVar15,retaddr);
  }
  uVar22 = (ulong)local_a4;
  puVar18 = (uint *)((long)env->gpr_a + (uVar25 - 0x40));
  uVar20 = addr & 0xffffc000;
  if ((local_a4 & 0xffffe000) != uVar20) {
    _Var7 = victim_tlb_hit(env,uVar15,index,(size_t)elt_ofs,uVar20);
    if (!_Var7) {
      uVar22 = 0;
      in_stack_ffffffffffffff48 = retaddr;
      cVar8 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                        (&env[-0x32].cpu_model,addr_00,len,iVar1,uVar15);
      if (cVar8 == '\0') goto LAB_00d1cadb;
      uVar16 = uVar9 & *puVar18 >> 6;
      index = (size_t)uVar16;
      puVar24 = (uint *)((ulong)(uVar16 << 6) + *(long *)((long)env->gpr_a + (uVar25 - 0x38)));
    }
    local_a4 = puVar24[(ulong)code_read * 2] & 0xffffdfff;
  }
  uVar16 = addr & 0x3fff;
  local_a0 = (ulong)(puVar24[3] | uVar16);
  pMVar10 = (*puVar2->memory_mapping)(puVar2,local_a0);
  if (pMVar10 == (MemoryRegion *)0x0) {
    iVar17 = puVar2->invalid_error;
    if (iVar17 == 0) {
      if (code_read) {
        plVar19 = puVar2->hook[6].head;
        iVar17 = 8;
        if (plVar19 == (list_item *)0x0) goto LAB_00d1c415;
        bVar6 = 0;
        while (pvVar3 = plVar19->data, pvVar3 != (void *)0x0) {
          if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
             (((*(ulong *)((long)pvVar3 + 0x18) <= local_a0 &&
               (local_a0 <= *(ulong *)((long)pvVar3 + 0x20))) ||
              (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))))) {
            uVar22 = *(ulong *)((long)pvVar3 + 0x30);
            bVar6 = (**(code **)((long)pvVar3 + 0x28))(puVar2,0x15,local_a0,len,0);
            if ((bVar6 != 0) || (puVar2->stop_request != false)) break;
          }
          plVar19 = plVar19->next;
          if (plVar19 == (list_item *)0x0) break;
        }
      }
      else {
        plVar19 = puVar2->hook[4].head;
        iVar17 = 6;
        if (plVar19 == (list_item *)0x0) goto LAB_00d1c415;
        bVar6 = 0;
        while (pvVar3 = plVar19->data, pvVar3 != (void *)0x0) {
          if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
             (((*(ulong *)((long)pvVar3 + 0x18) <= local_a0 &&
               (local_a0 <= *(ulong *)((long)pvVar3 + 0x20))) ||
              (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))))) {
            uVar22 = *(ulong *)((long)pvVar3 + 0x30);
            bVar6 = (**(code **)((long)pvVar3 + 0x28))(puVar2,0x13,local_a0,len,0);
            if ((bVar6 != 0) || (puVar2->stop_request != false)) break;
          }
          plVar19 = plVar19->next;
          if (plVar19 == (list_item *)0x0) break;
        }
      }
    }
    else {
LAB_00d1c415:
      bVar6 = 0;
    }
    if ((bVar6 & 1) == 0) {
      puVar2->invalid_addr = local_a0;
      puVar2->invalid_error = iVar17;
      goto LAB_00d1c7a5;
    }
    puVar2->invalid_error = 0;
    if ((local_a4 & 0xffffe000) != uVar20) {
      _Var7 = victim_tlb_hit(env,uVar15,index,(size_t)elt_ofs,uVar20);
      if (!_Var7) {
        uVar22 = 0;
        in_stack_ffffffffffffff48 = retaddr;
        cVar8 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                          (&env[-0x32].cpu_model,addr_00,len,iVar1,uVar15);
        if (cVar8 == '\0') goto LAB_00d1cadb;
        uVar21 = uVar9 & *puVar18 >> 6;
        index = (size_t)uVar21;
        puVar24 = (uint *)((ulong)(uVar21 << 6) + *(long *)((long)env->gpr_a + (uVar25 - 0x38)));
      }
      local_a4 = puVar24[(ulong)code_read * 2] & 0xffffdfff;
    }
    local_a0 = (ulong)(puVar24[3] | uVar16);
    pMVar10 = (*puVar2->memory_mapping)(puVar2,local_a0);
    if (pMVar10 == (MemoryRegion *)0x0) {
      puVar2->invalid_error = 0xb;
      goto LAB_00d1c7a5;
    }
  }
  op_00 = (MemOp)in_stack_ffffffffffffff48;
  access_type = (MMUAccessType)uVar22;
  if (code_read) {
    pCVar26 = elt_ofs;
    if ((pMVar10->perms & 4) == 0) {
      plVar19 = puVar2->hook[9].head;
      if (plVar19 != (list_item *)0x0) {
        bVar6 = 0;
        while( true ) {
          op_00 = (MemOp)in_stack_ffffffffffffff48;
          access_type = (MMUAccessType)uVar22;
          pvVar3 = plVar19->data;
          if (pvVar3 == (void *)0x0) break;
          if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
             (((*(ulong *)((long)pvVar3 + 0x18) <= local_a0 &&
               (local_a0 <= *(ulong *)((long)pvVar3 + 0x20))) ||
              (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))))) {
            uVar22 = *(ulong *)((long)pvVar3 + 0x30);
            bVar6 = (**(code **)((long)pvVar3 + 0x28))(puVar2,0x18,local_a0,len,0);
            op_00 = (MemOp)in_stack_ffffffffffffff48;
            access_type = (MMUAccessType)uVar22;
            if ((bVar6 != 0) || (puVar2->stop_request != false)) break;
          }
          op_00 = (MemOp)in_stack_ffffffffffffff48;
          access_type = (MMUAccessType)uVar22;
          plVar19 = plVar19->next;
          if (plVar19 == (list_item *)0x0) break;
        }
        if ((bVar6 & 1) != 0) {
          puVar2->invalid_error = 0;
          pCVar26 = (CPUArchState_conflict30 *)(ulong)uVar16;
          goto LAB_00d1c84b;
        }
      }
      puVar2->invalid_addr = local_a0;
      puVar2->invalid_error = 0xe;
LAB_00d1c7a5:
      if ((0 < puVar2->nested_level) && (puVar2->cpu->stopped == false)) {
        cpu_exit(puVar2->cpu);
        cpu_loop_exit_tricore((CPUState_conflict *)puVar2->cpu);
      }
      return 0;
    }
  }
  else {
    for (pCVar26 = (CPUArchState_conflict30 *)puVar2->hook[10].head;
        (pCVar26 != (CPUArchState_conflict30 *)0x0 &&
        (pvVar3 = *(void **)((long)pCVar26->gpr_a + 8), pvVar3 != (void *)0x0));
        pCVar26 = *(CPUArchState_conflict30 **)pCVar26->gpr_a) {
      if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
         (((*(ulong *)((long)pvVar3 + 0x18) <= local_a0 &&
           (local_a0 <= *(ulong *)((long)pvVar3 + 0x20))) ||
          (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))))) {
        uVar22 = *(ulong *)((long)pvVar3 + 0x30);
        (**(code **)((long)pvVar3 + 0x28))(env->uc,0x10,local_a0,len,0);
        if (puVar2->stop_request != false) break;
      }
    }
    op_00 = (MemOp)in_stack_ffffffffffffff48;
    access_type = (MMUAccessType)uVar22;
    if ((pMVar10->perms & 1) == 0) {
      plVar19 = puVar2->hook[7].head;
      if (plVar19 != (list_item *)0x0) {
        bVar6 = 0;
        while( true ) {
          op_00 = (MemOp)in_stack_ffffffffffffff48;
          access_type = (MMUAccessType)uVar22;
          pvVar3 = plVar19->data;
          if (pvVar3 == (void *)0x0) break;
          if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
             (((*(ulong *)((long)pvVar3 + 0x18) <= local_a0 &&
               (local_a0 <= *(ulong *)((long)pvVar3 + 0x20))) ||
              (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))))) {
            uVar22 = *(ulong *)((long)pvVar3 + 0x30);
            bVar6 = (**(code **)((long)pvVar3 + 0x28))(puVar2,0x17,local_a0,len,0);
            op_00 = (MemOp)in_stack_ffffffffffffff48;
            access_type = (MMUAccessType)uVar22;
            if ((bVar6 != 0) || (puVar2->stop_request != false)) break;
          }
          op_00 = (MemOp)in_stack_ffffffffffffff48;
          access_type = (MMUAccessType)uVar22;
          plVar19 = plVar19->next;
          if (plVar19 == (list_item *)0x0) break;
        }
        if ((bVar6 & 1) != 0) {
          puVar2->invalid_error = 0;
          pCVar26 = env;
          if ((local_a4 & 0xffffe000) != uVar20) {
            _Var7 = victim_tlb_hit(env,uVar15,index,(size_t)elt_ofs,uVar20);
            if (!_Var7) {
              access_type = MMU_DATA_LOAD;
              uVar23 = retaddr;
              cVar8 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                                (&env[-0x32].cpu_model,addr_00,len,iVar1,uVar15);
              op_00 = (MemOp)uVar23;
              if (cVar8 == '\0') {
LAB_00d1cadb:
                __assert_fail("ok",
                              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                              ,0x3c7,
                              "void tlb_fill(CPUState *, target_ulong, int, MMUAccessType, int, uintptr_t)"
                             );
              }
              uVar9 = uVar9 & *puVar18 >> 6;
              index = (size_t)uVar9;
              puVar24 = (uint *)((ulong)(uVar9 << 6) + *(long *)((long)env->gpr_a + (uVar25 - 0x38))
                                );
            }
            local_a4 = *puVar24 & 0xffffdfff;
          }
          goto LAB_00d1c84b;
        }
      }
      puVar2->invalid_addr = local_a0;
      puVar2->invalid_error = 0xd;
      goto LAB_00d1c7a5;
    }
  }
LAB_00d1c84b:
  if ((local_a4 & 0x3fff) == 0) {
    if ((MVar13 == MO_8) || (0xffffffffffffbfff < (ulong)(uVar16 + uVar14) - 0x4001)) {
      pCVar26 = (CPUArchState_conflict30 *)0x0;
      if (op < (MO_BE|MO_ASHIFT)) {
        lVar4 = *(long *)(puVar24 + 4);
        switch(op) {
        case MO_8:
          pCVar26 = (CPUArchState_conflict30 *)(ulong)*(byte *)(lVar4 + addr_00);
          break;
        case MO_16:
          pCVar26 = (CPUArchState_conflict30 *)(ulong)*(ushort *)(lVar4 + addr_00);
          break;
        case MO_32:
          pCVar26 = (CPUArchState_conflict30 *)(ulong)*(uint *)(lVar4 + addr_00);
          break;
        case MO_64:
          pCVar26 = *(CPUArchState_conflict30 **)(lVar4 + addr_00);
          break;
        case MO_BEUW:
          pCVar26 = (CPUArchState_conflict30 *)
                    (ulong)(ushort)(*(ushort *)(lVar4 + addr_00) << 8 |
                                   *(ushort *)(lVar4 + addr_00) >> 8);
          break;
        case MO_BEUL:
          uVar9 = *(uint *)(lVar4 + addr_00);
          pCVar26 = (CPUArchState_conflict30 *)
                    (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                           uVar9 << 0x18);
          break;
        case MO_BEQ:
          uVar15 = *(ulong *)(lVar4 + addr_00);
          pCVar26 = (CPUArchState_conflict30 *)
                    (uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                     (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                     (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                     (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38);
        }
      }
      goto switchD_00d1c893_caseD_4;
    }
  }
  else {
    if ((addr & uVar14 - 1) == 0) {
      iotlbentry = (CPUIOTLBEntry *)
                   (*(long *)((long)env + uVar15 * 0x2b0 + -0x5a8) + (ulong)(uint)((int)index << 4))
      ;
      if ((local_a4 >> 10 & 1) != 0) {
        uVar23 = retaddr;
        cpu_check_watchpoint_tricore
                  ((CPUState *)&env[-0x32].cpu_model,addr_00,len,iotlbentry->attrs,1,retaddr);
        access_type = (MMUAccessType)uVar23;
      }
      bVar6 = (byte)(local_a4 >> 9) & 1 & MVar13 != MO_8;
      if ((local_a4 >> 0xb & 1) == 0) {
        MVar13 = op;
        if (bVar6 != 0) {
          MVar13 = op ^ MO_BE;
        }
        pCVar26 = (CPUArchState_conflict30 *)
                  load_memop((void *)(*(long *)(puVar24 + 4) + addr_00),MVar13);
      }
      else {
        pCVar26 = (CPUArchState_conflict30 *)
                  io_readx(env,iotlbentry,addr,(target_ulong_conflict)retaddr,
                           (ulong)((uint)bVar6 << 3 ^ op),access_type,op_00);
      }
    }
    if ((addr & uVar14 - 1) == 0) goto switchD_00d1c893_caseD_4;
  }
  iVar1 = puVar2->size_recur_mem;
  puVar2->size_recur_mem = uVar14;
  uVar11 = (*full_load)(env,-uVar14 & addr,oi,retaddr);
  uVar12 = (*full_load)(env,(-uVar14 & addr) + uVar14,oi,retaddr);
  puVar2->size_recur_mem = iVar1;
  bVar5 = (byte)((uVar14 - 1 & addr) << 3);
  bVar6 = (char)uVar14 * '\b' - bVar5;
  if ((op & MO_BE) == MO_8) {
    uVar15 = uVar11 >> (bVar5 & 0x3f);
    uVar25 = uVar12 << (bVar6 & 0x3f);
  }
  else {
    uVar15 = uVar11 << (bVar5 & 0x3f);
    uVar25 = uVar12 >> (bVar6 & 0x3f);
  }
  bVar6 = (char)uVar14 * -8;
  pCVar26 = (CPUArchState_conflict30 *)(((uVar25 | uVar15) << (bVar6 & 0x3f)) >> (bVar6 & 0x3f));
switchD_00d1c893_caseD_4:
  if (((!code_read) && (puVar2->size_recur_mem == 0)) &&
     (plVar19 = puVar2->hook[0xd].head, plVar19 != (list_item *)0x0)) {
    while (pvVar3 = plVar19->data, pvVar3 != (void *)0x0) {
      if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
         ((((*(ulong *)((long)pvVar3 + 0x18) <= local_a0 &&
            (local_a0 <= *(ulong *)((long)pvVar3 + 0x20))) ||
           (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))) &&
          ((**(code **)((long)pvVar3 + 0x28))
                     (env->uc,0x19,local_a0,len,pCVar26,*(undefined8 *)((long)pvVar3 + 0x30)),
          puVar2->stop_request != false)))) {
        return (uint64_t)pCVar26;
      }
      plVar19 = plVar19->next;
      if (plVar19 == (list_item *)0x0) {
        return (uint64_t)pCVar26;
      }
    }
  }
  return (uint64_t)pCVar26;
}

Assistant:

static uint64_t inline
load_helper(CPUArchState *env, target_ulong addr, TCGMemOpIdx oi,
            uintptr_t retaddr, MemOp op, bool code_read,
            FullLoadHelper *full_load)
{
    uintptr_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = code_read ? entry->addr_code : entry->addr_read;
    target_ulong paddr;
    const size_t tlb_off = code_read ?
        offsetof(CPUTLBEntry, addr_code) : offsetof(CPUTLBEntry, addr_read);
    const MMUAccessType access_type =
        code_read ? MMU_INST_FETCH : MMU_DATA_LOAD;
    unsigned a_bits = get_alignment_bits(get_memop(oi));
    void *haddr;
    uint64_t res;
    size_t size = memop_size(op);
    int error_code;
    struct hook *hook;
    bool handled;
    HOOK_FOREACH_VAR_DECLARE;
    struct uc_struct *uc = env->uc;
    MemoryRegion *mr;

    /* Handle CPU specific unaligned behaviour */
    if (addr & ((1 << a_bits) - 1)) {
        cpu_unaligned_access(env_cpu(env), addr, access_type,
                             mmu_idx, retaddr);
    }

    /* If the TLB entry is for a different page, reload and try again.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size,
                     access_type, mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = code_read ? entry->addr_code : entry->addr_read;
        tlb_addr &= ~TLB_INVALID_MASK;
    }

    paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
    mr = uc->memory_mapping(uc, paddr);

    // memory might be still unmapped while reading or fetching
    if (mr == NULL) {
        handled = false;
        // if there is already an unhandled eror, skip callbacks.
        if (uc->invalid_error == UC_ERR_OK) {
            if (code_read) {
                // code fetching
                error_code = UC_ERR_FETCH_UNMAPPED;
                HOOK_FOREACH(uc, hook, UC_HOOK_MEM_FETCH_UNMAPPED) {
                    if (hook->to_delete)
                        continue;
                    if (!HOOK_BOUND_CHECK(hook, paddr))
                        continue;
                    if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_FETCH_UNMAPPED, paddr, size, 0, hook->user_data)))
                        break;

                    // the last callback may already asked to stop emulation
                    if (uc->stop_request)
                        break;
                }
            } else {
                // data reading
                error_code = UC_ERR_READ_UNMAPPED;
                HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_UNMAPPED) {
                    if (hook->to_delete)
                        continue;
                    if (!HOOK_BOUND_CHECK(hook, paddr))
                        continue;
                    if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_READ_UNMAPPED, paddr, size, 0, hook->user_data)))
                        break;

                    // the last callback may already asked to stop emulation
                    if (uc->stop_request)
                        break;
                }
            }
        } else {
            error_code = uc->invalid_error;
        }

        if (handled) {
            uc->invalid_error = UC_ERR_OK;
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size,
                             access_type, mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = code_read ? entry->addr_code : entry->addr_read;
                tlb_addr &= ~TLB_INVALID_MASK;
            }
            paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
            mr = uc->memory_mapping(uc, paddr);
            if (mr == NULL) {
                uc->invalid_error = UC_ERR_MAP;
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // XXX(@lazymio): We have to exit early so that the target register won't be overwritten
                    //                because qemu might generate tcg code like:
                    //                       qemu_ld_i64 x0,x1,leq,8  sync: 0  dead: 0 1
                    //                where we don't have a change to recover x0 value
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        } else {
            uc->invalid_addr = paddr;
            uc->invalid_error = error_code;
            // printf("***** Invalid fetch (unmapped memory) at " TARGET_FMT_lx "\n", addr);
            if (uc->nested_level > 0 && !uc->cpu->stopped) {
                cpu_exit(uc->cpu);
                // See comments above
                cpu_loop_exit(uc->cpu);
            }
            return 0;
        }
    }

    // now it is read on mapped memory
    if (!code_read) {
        // this is date reading
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            ((uc_cb_hookmem_t)hook->callback)(env->uc, UC_MEM_READ, paddr, size, 0, hook->user_data);

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        // callback on non-readable memory
        if (mr != NULL && !(mr->perms & UC_PROT_READ)) {  //non-readable
            handled = false;
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_PROT) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_READ_PROT, paddr, size, 0, hook->user_data)))
                    break;

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }

            if (handled) {
                uc->invalid_error = UC_ERR_OK;
                /* If the TLB entry is for a different page, reload and try again.  */
                if (!tlb_hit(env->uc, tlb_addr, addr)) {
                    if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                                        addr & TARGET_PAGE_MASK)) {
                        tlb_fill(env_cpu(env), addr, size,
                                 access_type, mmu_idx, retaddr);
                        index = tlb_index(env, mmu_idx, addr);
                        entry = tlb_entry(env, mmu_idx, addr);
                    }
                    tlb_addr = code_read ? entry->addr_code : entry->addr_read;
                    tlb_addr &= ~TLB_INVALID_MASK;
                }
            } else {
                uc->invalid_addr = paddr;
                uc->invalid_error = UC_ERR_READ_PROT;
                // printf("***** Invalid memory read (non-readable) at " TARGET_FMT_lx "\n", addr);
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // See comments above
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        }
    } else {
        // code fetching
        // Unicorn: callback on fetch from NX
        if (mr != NULL && !(mr->perms & UC_PROT_EXEC)) {  // non-executable
            handled = false;
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_FETCH_PROT) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_FETCH_PROT, paddr, size, 0, hook->user_data)))
                    break;

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }

            if (handled) {
                uc->invalid_error = UC_ERR_OK;
            } else {
                uc->invalid_addr = paddr;
                uc->invalid_error = UC_ERR_FETCH_PROT;
                // printf("***** Invalid fetch (non-executable) at " TARGET_FMT_lx "\n", addr);
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // See comments above
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        }
    }

    /* Handle anything that isn't just a straight memory access.  */
    if (unlikely(tlb_addr & ~TARGET_PAGE_MASK)) {
        CPUIOTLBEntry *iotlbentry;
        bool need_swap;

        /* For anything that is unaligned, recurse through full_load.  */
        if ((addr & (size - 1)) != 0) {
            goto do_unaligned_access;
        }

        iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Handle watchpoints.  */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            /* On watchpoint hit, this will longjmp out.  */
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, BP_MEM_READ, retaddr);
        }

        need_swap = size > 1 && (tlb_addr & TLB_BSWAP);

        /* Handle I/O access.  */
        if (likely(tlb_addr & TLB_MMIO)) {
            res = io_readx(env, iotlbentry, mmu_idx, addr, retaddr,
                            access_type, op ^ (need_swap * MO_BSWAP));
            goto _out;
        }

        haddr = (void *)((uintptr_t)addr + entry->addend);

        /*
         * Keep these two load_memop separate to ensure that the compiler
         * is able to fold the entire function to a single instruction.
         * There is a build-time assert inside to remind you of this.  ;-)
         */
        if (unlikely(need_swap)) {
            res = load_memop(haddr, op ^ MO_BSWAP);
            goto _out;
        }
        res = load_memop(haddr, op);
        goto _out;
    }

    /* Handle slow unaligned access (it spans two pages or IO).  */
    if (size > 1
        && unlikely((addr & ~TARGET_PAGE_MASK) + size - 1
                    >= TARGET_PAGE_SIZE)) {
        target_ulong addr1, addr2;
        uint64_t r1, r2;
        unsigned shift;
        int old_size;
    do_unaligned_access:
        addr1 = addr & ~((target_ulong)size - 1);
        addr2 = addr1 + size;
        old_size = uc->size_recur_mem;
        uc->size_recur_mem = size;
        r1 = full_load(env, addr1, oi, retaddr);
        r2 = full_load(env, addr2, oi, retaddr);
        uc->size_recur_mem = old_size;
        shift = (addr & (size - 1)) * 8;

        if (memop_big_endian(op)) {
            /* Big-endian combine.  */
            res = (r1 << shift) | (r2 >> ((size * 8) - shift));
        } else {
            /* Little-endian combine.  */
            res = (r1 >> shift) | (r2 << ((size * 8) - shift));
        }
        res = res & MAKE_64BIT_MASK(0, size * 8);
        goto _out;
    }

    haddr = (void *)((uintptr_t)addr + entry->addend);
    res = load_memop(haddr, op);

_out:
    // Unicorn: callback on successful data read
    if (!code_read) {
        if (!uc->size_recur_mem) { // disabling read callback if in recursive call
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_AFTER) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                ((uc_cb_hookmem_t)hook->callback)(env->uc, UC_MEM_READ_AFTER, paddr, size, res, hook->user_data);

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }
        }
    }

    return res;
}